

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

Int __thiscall Json::Value::asInt(Value *this)

{
  bool bVar1;
  runtime_error *prVar2;
  double *in_RDI;
  Value *in_stack_ffffffffffffffb8;
  uint local_4;
  
  switch(*(undefined1 *)(in_RDI + 1)) {
  case 0:
    local_4 = 0;
    break;
  case 1:
    bVar1 = isInt(in_stack_ffffffffffffffb8);
    if (!bVar1) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"LargestInt out of Int range");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_4 = SUB84(*in_RDI,0);
    break;
  case 2:
    bVar1 = isInt(in_stack_ffffffffffffffb8);
    if (!bVar1) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"LargestUInt out of Int range");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_4 = SUB84(*in_RDI,0);
    break;
  case 3:
    bVar1 = InRange<int,int>(*in_RDI,-0x80000000,0x7fffffff);
    if (!bVar1) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"double out of Int range");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_4 = (uint)*in_RDI;
    break;
  default:
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"Value is not convertible to Int.");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case 5:
    local_4 = (uint)(((ulong)*in_RDI & 1) != 0);
  }
  return local_4;
}

Assistant:

Value::Int Value::asInt() const {
  switch (type_) {
  case intValue:
    JSON_ASSERT_MESSAGE(isInt(), "LargestInt out of Int range");
    return Int(value_.int_);
  case uintValue:
    JSON_ASSERT_MESSAGE(isInt(), "LargestUInt out of Int range");
    return Int(value_.uint_);
  case realValue:
    JSON_ASSERT_MESSAGE(InRange(value_.real_, minInt, maxInt),
                        "double out of Int range");
    return Int(value_.real_);
  case nullValue:
    return 0;
  case booleanValue:
    return value_.bool_ ? 1 : 0;
  default:
    break;
  }
  JSON_FAIL_MESSAGE("Value is not convertible to Int.");
}